

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSDDOMParser::startAnnotation
          (XSDDOMParser *this,XMLElementDecl *elemDecl,RefVectorOf<xercesc_4_0::XMLAttr> *attrList,
          XMLSize_t attrCount)

{
  ValueVectorOf<unsigned_int> *pVVar1;
  XMLScanner *pXVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  XMLCh *pXVar6;
  XMLSize_t XVar7;
  PrefMapElem **ppPVar8;
  XMLCh *prefix;
  ulong uStack_58;
  uint prefId;
  XMLSize_t j;
  ValueVectorOf<xercesc_4_0::PrefMapElem_*> *namespaceContext;
  XMLCh *local_40;
  XMLCh *attrValue;
  XMLAttr *oneAttrib;
  XMLSize_t i;
  XMLSize_t attrCount_local;
  RefVectorOf<xercesc_4_0::XMLAttr> *attrList_local;
  XMLElementDecl *elemDecl_local;
  XSDDOMParser *this_local;
  
  i = attrCount;
  attrCount_local = (XMLSize_t)attrList;
  attrList_local = (RefVectorOf<xercesc_4_0::XMLAttr> *)elemDecl;
  elemDecl_local = (XMLElementDecl *)this;
  XMLBuffer::append(&this->fAnnotationBuf,L'<');
  pXVar6 = XMLElementDecl::getFullName((XMLElementDecl *)attrList_local);
  XMLBuffer::append(&this->fAnnotationBuf,pXVar6);
  XMLBuffer::append(&this->fAnnotationBuf,L' ');
  ValueVectorOf<unsigned_int>::removeAllElements(this->fURIs);
  for (oneAttrib = (XMLAttr *)0x0; oneAttrib < i; oneAttrib = (XMLAttr *)&oneAttrib->field_0x1) {
    attrValue = (XMLCh *)BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                   ((BaseRefVectorOf<xercesc_4_0::XMLAttr> *)attrCount_local,
                                    (XMLSize_t)oneAttrib);
    local_40 = XMLAttr::getValue((XMLAttr *)attrValue);
    pXVar6 = XMLAttr::getName((XMLAttr *)attrValue);
    bVar4 = XMLString::equals(pXVar6,(XMLCh *)XMLUni::fgXMLNSString);
    if (bVar4) {
      pVVar1 = this->fURIs;
      namespaceContext._4_4_ =
           XMLScanner::getPrefixId
                     ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner,L"");
      ValueVectorOf<unsigned_int>::addElement(pVVar1,(uint *)((long)&namespaceContext + 4));
    }
    else {
      pXVar6 = XMLAttr::getQName((XMLAttr *)attrValue);
      iVar5 = XMLString::compareNString(pXVar6,(XMLCh *)XMLUni::fgXMLNSColonString,6);
      if (iVar5 == 0) {
        pVVar1 = this->fURIs;
        pXVar2 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
        pXVar6 = XMLAttr::getName((XMLAttr *)attrValue);
        namespaceContext._0_4_ = XMLScanner::getPrefixId(pXVar2,pXVar6);
        ValueVectorOf<unsigned_int>::addElement(pVVar1,(uint *)&namespaceContext);
      }
    }
    pXVar6 = XMLAttr::getQName((XMLAttr *)attrValue);
    XMLBuffer::append(&this->fAnnotationBuf,pXVar6);
    XMLBuffer::append(&this->fAnnotationBuf,L'=');
    XMLBuffer::append(&this->fAnnotationBuf,L'\"');
    XMLBuffer::append(&this->fAnnotationBuf,local_40);
    XMLBuffer::append(&this->fAnnotationBuf,L'\"');
    XMLBuffer::append(&this->fAnnotationBuf,L' ');
  }
  j = (XMLSize_t)
      XMLScanner::getNamespaceContext
                ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner);
  for (uStack_58 = 0; uVar3 = uStack_58,
      XVar7 = ValueVectorOf<xercesc_4_0::PrefMapElem_*>::size
                        ((ValueVectorOf<xercesc_4_0::PrefMapElem_*> *)j), uVar3 < XVar7;
      uStack_58 = uStack_58 + 1) {
    ppPVar8 = ValueVectorOf<xercesc_4_0::PrefMapElem_*>::elementAt
                        ((ValueVectorOf<xercesc_4_0::PrefMapElem_*> *)j,uStack_58);
    prefix._4_4_ = (*ppPVar8)->fPrefId;
    bVar4 = ValueVectorOf<unsigned_int>::containsElement(this->fURIs,(uint *)((long)&prefix + 4),0);
    if (!bVar4) {
      pXVar6 = XMLScanner::getPrefixForId
                         ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner,
                          prefix._4_4_);
      bVar4 = XMLString::equals(pXVar6,L"");
      if (bVar4) {
        XMLBuffer::append(&this->fAnnotationBuf,(XMLCh *)XMLUni::fgXMLNSString);
      }
      else {
        XMLBuffer::append(&this->fAnnotationBuf,(XMLCh *)XMLUni::fgXMLNSColonString);
        XMLBuffer::append(&this->fAnnotationBuf,pXVar6);
      }
      XMLBuffer::append(&this->fAnnotationBuf,L'=');
      XMLBuffer::append(&this->fAnnotationBuf,L'\"');
      pXVar2 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
      ppPVar8 = ValueVectorOf<xercesc_4_0::PrefMapElem_*>::elementAt
                          ((ValueVectorOf<xercesc_4_0::PrefMapElem_*> *)j,uStack_58);
      pXVar6 = XMLScanner::getURIText(pXVar2,(*ppPVar8)->fURIId);
      XMLBuffer::append(&this->fAnnotationBuf,pXVar6);
      XMLBuffer::append(&this->fAnnotationBuf,L'\"');
      XMLBuffer::append(&this->fAnnotationBuf,L' ');
      ValueVectorOf<unsigned_int>::addElement(this->fURIs,(uint *)((long)&prefix + 4));
    }
  }
  XMLBuffer::append(&this->fAnnotationBuf,L'>');
  XMLBuffer::append(&this->fAnnotationBuf,L'\n');
  return;
}

Assistant:

void XSDDOMParser::startAnnotation( const XMLElementDecl&       elemDecl
                                  , const RefVectorOf<XMLAttr>& attrList
                                  , const XMLSize_t             attrCount)
{
    fAnnotationBuf.append(chOpenAngle);
	fAnnotationBuf.append(elemDecl.getFullName());
    fAnnotationBuf.append(chSpace);

    // attributes are a bit of a pain.  To get this right, we have to keep track
    // of the namespaces we've seen declared, then examine the namespace context
    // for other namespaces so that we can also include them.
    // optimized for simplicity and the case that not many
    // namespaces are declared on this annotation...
    fURIs->removeAllElements();
    for (XMLSize_t i=0; i < attrCount; i++) {

        const XMLAttr* oneAttrib = attrList.elementAt(i);
        const XMLCh* attrValue = oneAttrib->getValue();

        if (XMLString::equals(oneAttrib->getName(), XMLUni::fgXMLNSString))
            fURIs->addElement(fScanner->getPrefixId(XMLUni::fgZeroLenString));
        else  if (!XMLString::compareNString(oneAttrib->getQName(), XMLUni::fgXMLNSColonString, 6))
            fURIs->addElement(fScanner->getPrefixId(oneAttrib->getName()));

        fAnnotationBuf.append(oneAttrib->getQName());
        fAnnotationBuf.append(chEqual);
        fAnnotationBuf.append(chDoubleQuote);
        fAnnotationBuf.append(attrValue);
        fAnnotationBuf.append(chDoubleQuote);
        fAnnotationBuf.append(chSpace);
    }

    // now we have to look through currently in-scope namespaces to see what
    // wasn't declared here
    ValueVectorOf<PrefMapElem*>* namespaceContext = fScanner->getNamespaceContext();
    for (XMLSize_t j=0; j < namespaceContext->size(); j++)
    {
        unsigned int prefId = namespaceContext->elementAt(j)->fPrefId;

        if (!fURIs->containsElement(prefId)) {

            const XMLCh* prefix = fScanner->getPrefixForId(prefId);

            if (XMLString::equals(prefix, XMLUni::fgZeroLenString)) {
                fAnnotationBuf.append(XMLUni::fgXMLNSString);
            }
            else  {
                fAnnotationBuf.append(XMLUni::fgXMLNSColonString);
                fAnnotationBuf.append(prefix);
            }

            fAnnotationBuf.append(chEqual);
            fAnnotationBuf.append(chDoubleQuote);
            fAnnotationBuf.append(fScanner->getURIText(namespaceContext->elementAt(j)->fURIId));
            fAnnotationBuf.append(chDoubleQuote);
            fAnnotationBuf.append(chSpace);

            fURIs->addElement(prefId);
        }
    }

    fAnnotationBuf.append(chCloseAngle);
    fAnnotationBuf.append(chLF);
}